

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell::
~TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell
          (TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell *mem;
  TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_SevenPairs_FourSuit)
{
	addPair(Tile::EastWind);
	addPair(Tile::NorthWind);
	addPair(Tile::ThreeOfCharacters);
	addPair(Tile::NineOfCircles);
	addPair(Tile::OneOfBamboos);
	addPair(Tile::GreenDragon);
	addPair(Tile::GreenDragon);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::SevenPairs));
}